

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FILongValueImpl::~FILongValueImpl(FILongValueImpl *this)

{
  (this->super_FILongValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__00823350;
  std::__cxx11::string::~string((string *)&this->strValue);
  FILongValue::~FILongValue(&this->super_FILongValue);
  return;
}

Assistant:

inline FILongValueImpl(std::vector<int64_t> &&value_): strValueValid(false) { value = std::move(value_); }